

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void R_BuildPlayerTranslation(int player)

{
  FPlayerSkin *pFVar1;
  int iVar2;
  long lVar3;
  float v;
  float s;
  float h;
  FPlayerColorSet *colorset;
  float local_3c;
  float local_38;
  float local_34;
  FPlayerColorSet *local_30;
  
  D_GetPlayerColor(player,&local_34,&local_38,&local_3c,&local_30);
  pFVar1 = skins;
  lVar3 = (long)player;
  iVar2 = userinfo_t::GetSkin((userinfo_t *)(&DAT_017dbfb8 + lVar3 * 0x2a0));
  R_CreatePlayerTranslation
            (local_34,local_38,local_3c,local_30,pFVar1 + iVar2,
             translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar3].Ptr,
             translationtables[2].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar3].Ptr,
             translationtables[9].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar3].Ptr);
  return;
}

Assistant:

void R_BuildPlayerTranslation (int player)
{
	float h, s, v;
	FPlayerColorSet *colorset;

	D_GetPlayerColor (player, &h, &s, &v, &colorset);

	R_CreatePlayerTranslation (h, s, v, colorset,
		&skins[players[player].userinfo.GetSkin()],
		translationtables[TRANSLATION_Players][player],
		translationtables[TRANSLATION_PlayersExtra][player],
		translationtables[TRANSLATION_RainPillar][player]
		);
}